

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_states.cpp
# Opt level: O0

void __thiscall duckdb::WindowAggregateStates::Finalize(WindowAggregateStates *this,Vector *result)

{
  aggregate_finalize_t p_Var1;
  FunctionData *ptr_p;
  type pVVar2;
  idx_t iVar3;
  Vector *in_RSI;
  WindowAggregateStates *in_RDI;
  AggregateInputData aggr_input_data;
  optional_ptr<duckdb::FunctionData,_true> local_30;
  AggregateInputData local_28;
  Vector *local_10;
  
  local_10 = in_RSI;
  ptr_p = AggregateObject::GetFunctionData(&in_RDI->aggr);
  optional_ptr<duckdb::FunctionData,_true>::optional_ptr(&local_30,ptr_p);
  AggregateInputData::AggregateInputData(&local_28,local_30,&in_RDI->allocator,PRESERVE_INPUT);
  p_Var1 = (in_RDI->aggr).function.finalize;
  pVVar2 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                      in_RDI);
  iVar3 = GetCount(in_RDI);
  (*p_Var1)(pVVar2,&local_28,local_10,iVar3,0);
  return;
}

Assistant:

void WindowAggregateStates::Finalize(Vector &result) {
	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	aggr.function.finalize(*statef, aggr_input_data, result, GetCount(), 0);
}